

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkDarRetimeMinArea
          (Abc_Ntk_t *pNtk,int nMaxIters,int fForwardOnly,int fBackwardOnly,int fInitial,
          int fVerbose)

{
  Aig_Man_t *p;
  Aig_Man_t *pMan_00;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int fInitial_local;
  int fBackwardOnly_local;
  int fForwardOnly_local;
  int nMaxIters_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (p->vFlopNums != (Vec_Int_t *)0x0) {
      Vec_IntFree(p->vFlopNums);
    }
    p->vFlopNums = (Vec_Int_t *)0x0;
    pMan_00 = Saig_ManRetimeMinArea(p,nMaxIters,fForwardOnly,fBackwardOnly,fInitial,fVerbose);
    Aig_ManStop(p);
    pNtk_local = Abc_NtkFromDarSeqSweep(pNtk,pMan_00);
    Aig_ManStop(pMan_00);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarRetimeMinArea( Abc_Ntk_t * pNtk, int nMaxIters, int fForwardOnly, int fBackwardOnly, int fInitial, int fVerbose )
{
    extern Aig_Man_t * Saig_ManRetimeMinArea( Aig_Man_t * p, int nMaxIters, int fForwardOnly, int fBackwardOnly, int fInitial, int fVerbose );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    if ( pMan->vFlopNums )
        Vec_IntFree( pMan->vFlopNums ); 
    pMan->vFlopNums = NULL;

    pMan = Saig_ManRetimeMinArea( pTemp = pMan, nMaxIters, fForwardOnly, fBackwardOnly, fInitial, fVerbose );
    Aig_ManStop( pTemp );

    pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}